

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void yaml_emitter_set_output(yaml_emitter_t *emitter,yaml_write_handler_t *handler,void *data)

{
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x1f2,
                  "void yaml_emitter_set_output(yaml_emitter_t *, yaml_write_handler_t *, void *)");
  }
  if (emitter->write_handler == (yaml_write_handler_t *)0x0) {
    if (handler != (yaml_write_handler_t *)0x0) {
      emitter->write_handler = handler;
      emitter->write_handler_data = data;
      return;
    }
    __assert_fail("handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,500,
                  "void yaml_emitter_set_output(yaml_emitter_t *, yaml_write_handler_t *, void *)");
  }
  __assert_fail("!emitter->write_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,499,
                "void yaml_emitter_set_output(yaml_emitter_t *, yaml_write_handler_t *, void *)");
}

Assistant:

YAML_DECLARE(void)
yaml_emitter_set_output(yaml_emitter_t *emitter,
        yaml_write_handler_t *handler, void *data)
{
    assert(emitter);    /* Non-NULL emitter object expected. */
    assert(!emitter->write_handler);    /* You can set the output only once. */
    assert(handler);    /* Non-NULL handler object expected. */

    emitter->write_handler = handler;
    emitter->write_handler_data = data;
}